

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

float nk_inv_sqrt(float n)

{
  float fVar1;
  undefined1 local_18 [4];
  undefined4 local_14;
  anon_union_4_2_947300a4 conv;
  float threehalfs;
  float x2;
  float n_local;
  
  local_14 = 0x3fc00000;
  threehalfs = n;
  memset(local_18,0,4);
  fVar1 = (float)(0x5f375a84 - ((uint)threehalfs >> 1));
  return fVar1 * (-(threehalfs * 0.5 * fVar1) * fVar1 + 1.5);
}

Assistant:

NK_LIB float
nk_inv_sqrt(float n)
{
    float x2;
    const float threehalfs = 1.5f;
    union {nk_uint i; float f;} conv = {0};
    conv.f = n;
    x2 = n * 0.5f;
    conv.i = 0x5f375A84 - (conv.i >> 1);
    conv.f = conv.f * (threehalfs - (x2 * conv.f * conv.f));
    return conv.f;
}